

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int gost_decode_nid_params(EVP_PKEY *pkey,int pkey_nid,int param_nid)

{
  int iVar1;
  void *pvVar2;
  EC_KEY *key;
  int in_ESI;
  EVP_PKEY *in_RDI;
  void *key_ptr;
  int in_stack_00000034;
  EC_KEY *in_stack_00000038;
  undefined4 local_4;
  
  pvVar2 = EVP_PKEY_get0(in_RDI);
  if (((in_ESI == 0x32b) || (in_ESI == 0x331)) || (in_ESI == 0x3d3 || in_ESI == 0x3d4)) {
    if (pvVar2 == (void *)0x0) {
      key = EC_KEY_new();
      iVar1 = EVP_PKEY_assign(in_RDI,in_ESI,key);
      if (iVar1 == 0) {
        EC_KEY_free(key);
        goto LAB_00115bda;
      }
    }
    local_4 = fill_GOST_EC_params(in_stack_00000038,in_stack_00000034);
  }
  else {
LAB_00115bda:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_decode_nid_params(EVP_PKEY *pkey, int pkey_nid, int param_nid)
{
    void *key_ptr = EVP_PKEY_get0(pkey);

    switch (pkey_nid) {
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2012_512:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        if (!key_ptr) {
            key_ptr = EC_KEY_new();
            if (!EVP_PKEY_assign(pkey, pkey_nid, key_ptr)) {
                EC_KEY_free(key_ptr);
                break;
            }
        }
        return fill_GOST_EC_params(key_ptr, param_nid);
    }

    return 0;
}